

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O1

string * toString_abi_cxx11_(string *__return_storage_ptr__,XMLError error)

{
  pointer pcVar1;
  undefined8 uVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  uint uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  ulong uVar8;
  XMLError __val;
  char *pcVar9;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(error) {
  case XML_SUCCESS:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_SUCCESS";
    pcVar7 = "";
    break;
  case XML_NO_ATTRIBUTE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_NO_ATTRIBUTE";
    pcVar7 = "";
    break;
  case XML_WRONG_ATTRIBUTE_TYPE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_WRONG_ATTRIBUTE_TYPE";
    pcVar7 = "";
    break;
  case XML_ERROR_FILE_NOT_FOUND:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_FILE_NOT_FOUND";
    pcVar7 = "";
    break;
  case XML_ERROR_FILE_COULD_NOT_BE_OPENED:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_FILE_COULD_NOT_BE_OPENED";
    pcVar7 = "";
    break;
  case XML_ERROR_FILE_READ_ERROR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_FILE_READ_ERROR";
    pcVar7 = "";
    break;
  case XML_ERROR_PARSING_ELEMENT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_PARSING_ELEMENT";
    pcVar7 = "";
    break;
  case XML_ERROR_PARSING_ATTRIBUTE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_PARSING_ATTRIBUTE";
    pcVar7 = "";
    break;
  case XML_ERROR_PARSING_TEXT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_PARSING_TEXT";
    pcVar7 = "";
    break;
  case XML_ERROR_PARSING_CDATA:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_PARSING_CDATA";
    pcVar7 = "";
    break;
  case XML_ERROR_PARSING_COMMENT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_PARSING_COMMENT";
    pcVar7 = "";
    break;
  case XML_ERROR_PARSING_DECLARATION:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_PARSING_DECLARATION";
    pcVar7 = "";
    break;
  case XML_ERROR_PARSING_UNKNOWN:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_PARSING_UNKNOWN";
    pcVar7 = "";
    break;
  case XML_ERROR_EMPTY_DOCUMENT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_EMPTY_DOCUMENT";
    pcVar7 = "";
    break;
  case XML_ERROR_MISMATCHED_ELEMENT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_MISMATCHED_ELEMENT";
    pcVar7 = "";
    break;
  case XML_ERROR_PARSING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_ERROR_PARSING";
    pcVar7 = "";
    break;
  case XML_CAN_NOT_CONVERT_TEXT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_CAN_NOT_CONVERT_TEXT";
    pcVar7 = "";
    break;
  case XML_NO_TEXT_NODE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "XML_NO_TEXT_NODE";
    pcVar7 = "";
    break;
  default:
    __val = -error;
    if (0 < (int)error) {
      __val = error;
    }
    __len = 1;
    if (XML_ERROR_PARSING_CDATA < __val) {
      uVar8 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar5 = (uint)uVar8;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_0011b4e9;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_0011b4e9;
        }
        if (uVar5 < 10000) goto LAB_0011b4e9;
        uVar8 = uVar8 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_0011b4e9:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_50,(ulong)(__len + -((int)error >> 0x1f)),'-');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_50._M_dataplus._M_p + (uint)-((int)error >> 0x1f),__len,__val);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_50,0,0,"unknown error code <",0x14);
    local_70._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar6) {
      local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_70._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,">");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar6) {
      uVar2 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString( tinyxml2::XMLError error )
{
  switch ( error )
  {
    case tinyxml2::XML_SUCCESS: return "XML_SUCCESS";
    case tinyxml2::XML_NO_ATTRIBUTE: return "XML_NO_ATTRIBUTE";
    case tinyxml2::XML_WRONG_ATTRIBUTE_TYPE: return "XML_WRONG_ATTRIBUTE_TYPE";
    case tinyxml2::XML_ERROR_FILE_NOT_FOUND: return "XML_ERROR_FILE_NOT_FOUND";
    case tinyxml2::XML_ERROR_FILE_COULD_NOT_BE_OPENED: return "XML_ERROR_FILE_COULD_NOT_BE_OPENED";
    case tinyxml2::XML_ERROR_FILE_READ_ERROR: return "XML_ERROR_FILE_READ_ERROR";
    case tinyxml2::XML_ERROR_PARSING_ELEMENT: return "XML_ERROR_PARSING_ELEMENT";
    case tinyxml2::XML_ERROR_PARSING_ATTRIBUTE: return "XML_ERROR_PARSING_ATTRIBUTE";
    case tinyxml2::XML_ERROR_PARSING_TEXT: return "XML_ERROR_PARSING_TEXT";
    case tinyxml2::XML_ERROR_PARSING_CDATA: return "XML_ERROR_PARSING_CDATA";
    case tinyxml2::XML_ERROR_PARSING_COMMENT: return "XML_ERROR_PARSING_COMMENT";
    case tinyxml2::XML_ERROR_PARSING_DECLARATION: return "XML_ERROR_PARSING_DECLARATION";
    case tinyxml2::XML_ERROR_PARSING_UNKNOWN: return "XML_ERROR_PARSING_UNKNOWN";
    case tinyxml2::XML_ERROR_EMPTY_DOCUMENT: return "XML_ERROR_EMPTY_DOCUMENT";
    case tinyxml2::XML_ERROR_MISMATCHED_ELEMENT: return "XML_ERROR_MISMATCHED_ELEMENT";
    case tinyxml2::XML_ERROR_PARSING: return "XML_ERROR_PARSING";
    case tinyxml2::XML_CAN_NOT_CONVERT_TEXT: return "XML_CAN_NOT_CONVERT_TEXT";
    case tinyxml2::XML_NO_TEXT_NODE: return "XML_NO_TEXT_NODE";
    default: return "unknown error code <" + std::to_string( error ) + ">";
  }
}